

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::UntypedMapBase::TableEntryIsTooLong(UntypedMapBase *this,map_index_t b)

{
  bool bVar1;
  NodeBase *node;
  
  node = TableEntryToNode(this->table_[b]);
  bVar1 = internal::TableEntryIsTooLong(node);
  return bVar1;
}

Assistant:

bool TableEntryIsTooLong(map_index_t b) {
    return internal::TableEntryIsTooLong(TableEntryToNode(table_[b]));
  }